

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O3

int __thiscall
zmq::router_t::xsetsockopt(router_t *this,int option_,void *optval_,size_t optvallen_)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = 0;
  if (optvallen_ == 4) {
    uVar3 = *optval_;
  }
  if (option_ < 0x33) {
    if (option_ == 0x21) {
      if (-1 < (int)uVar3 && optvallen_ == 4) {
        this->_mandatory = uVar3 != 0;
        return 0;
      }
    }
    else {
      if (option_ != 0x29) {
zmq_routing_socket_base_t_xsetsockopt:
        if ((option_ == 0x3d) && (optvallen_ != 0 && optval_ != (void *)0x0)) {
          iVar2 = 0;
          std::__cxx11::string::_M_replace
                    ((ulong)&(this->super_routing_socket_base_t)._connect_routing_id,0,
                     (char *)(this->super_routing_socket_base_t)._connect_routing_id.
                             _M_string_length,(ulong)optval_);
        }
        else {
          piVar1 = __errno_location();
          *piVar1 = 0x16;
          iVar2 = -1;
        }
        return iVar2;
      }
      if (-1 < (int)uVar3 && optvallen_ == 4) {
        this->_raw_socket = uVar3 != 0;
        if (uVar3 == 0) {
          return 0;
        }
        (this->super_routing_socket_base_t).super_socket_base_t.super_own_t.options.recv_routing_id
             = false;
        (this->super_routing_socket_base_t).super_socket_base_t.super_own_t.options.raw_socket =
             true;
        return 0;
      }
    }
  }
  else if (option_ == 0x33) {
    if (-1 < (int)uVar3 && optvallen_ == 4) {
      this->_probe_router = uVar3 != 0;
      return 0;
    }
  }
  else if (option_ == 0x38) {
    if (-1 < (int)uVar3 && optvallen_ == 4) {
      this->_handover = uVar3 != 0;
      return 0;
    }
  }
  else {
    if (option_ != 0x61) goto zmq_routing_socket_base_t_xsetsockopt;
    if (uVar3 < 4 && optvallen_ == 4) {
      (this->super_routing_socket_base_t).super_socket_base_t.super_own_t.options.router_notify =
           uVar3;
      return 0;
    }
  }
  piVar1 = __errno_location();
  *piVar1 = 0x16;
  return -1;
}

Assistant:

int zmq::router_t::xsetsockopt (int option_,
                                const void *optval_,
                                size_t optvallen_)
{
    const bool is_int = (optvallen_ == sizeof (int));
    int value = 0;
    if (is_int)
        memcpy (&value, optval_, sizeof (int));

    switch (option_) {
        case ZMQ_ROUTER_RAW:
            if (is_int && value >= 0) {
                _raw_socket = (value != 0);
                if (_raw_socket) {
                    options.recv_routing_id = false;
                    options.raw_socket = true;
                }
                return 0;
            }
            break;

        case ZMQ_ROUTER_MANDATORY:
            if (is_int && value >= 0) {
                _mandatory = (value != 0);
                return 0;
            }
            break;

        case ZMQ_PROBE_ROUTER:
            if (is_int && value >= 0) {
                _probe_router = (value != 0);
                return 0;
            }
            break;

        case ZMQ_ROUTER_HANDOVER:
            if (is_int && value >= 0) {
                _handover = (value != 0);
                return 0;
            }
            break;

#ifdef ZMQ_BUILD_DRAFT_API
        case ZMQ_ROUTER_NOTIFY:
            if (is_int && value >= 0
                && value <= (ZMQ_NOTIFY_CONNECT | ZMQ_NOTIFY_DISCONNECT)) {
                options.router_notify = value;
                return 0;
            }
            break;
#endif

        default:
            return routing_socket_base_t::xsetsockopt (option_, optval_,
                                                       optvallen_);
    }
    errno = EINVAL;
    return -1;
}